

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O0

void klondike_updateBoard(Board *board)

{
  code *pcVar1;
  Spot *pSVar2;
  Board *in_RDI;
  bool bVar3;
  Spot *tableau;
  uchar tableauCount;
  uchar i;
  byte local_1c;
  byte local_9;
  
  if (((gConfig.game)->id == TRIPLEKLONDIKETURN1) || ((gConfig.game)->id == TRIPLEKLONDIKETURN3)) {
    local_1c = 0xd;
  }
  else {
    bVar3 = true;
    if ((gConfig.game)->id != DOUBLEKLONDIKETURN1) {
      bVar3 = (gConfig.game)->id == DOUBLEKLONDIKETURN3;
    }
    local_1c = 7;
    if (bVar3) {
      local_1c = 9;
    }
  }
  local_9 = 0;
  do {
    if (local_1c <= local_9) {
      return;
    }
    pSVar2 = board_spotGet(in_RDI,TABLEAU,local_9);
    if (pSVar2->cardsCount != '\0') {
      if (SBORROW4((uint)pSVar2->cardsCount,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      if ((pSVar2->cards[(int)(pSVar2->cardsCount - 1)]->faceUp & 1U) == 0) {
        if (SBORROW4((uint)pSVar2->cardsCount,1)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        pSVar2->cards[(int)(pSVar2->cardsCount - 1)]->faceUp = true;
      }
    }
    local_9 = local_9 + 1;
  } while( true );
}

Assistant:

void klondike_updateBoard(Board * board)
{
	unsigned char i;
	unsigned char tableauCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 13 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 9 : 7));
	Spot * tableau;

	for(i=0;i<tableauCount;i++)
	{
		tableau = board_spotGet(board, TABLEAU, i);

		if(tableau->cardsCount==0)
			continue;

		if(!tableau->cards[tableau->cardsCount-1]->faceUp)
			tableau->cards[tableau->cardsCount-1]->faceUp = true;
	}
}